

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forrest_tomlin.cc
# Opt level: O0

void __thiscall ipx::ForrestTomlin::ComputeEta(ForrestTomlin *this,Int j)

{
  size_type sVar1;
  reference pvVar2;
  double *pdVar3;
  int in_ESI;
  long in_RDI;
  Int i;
  double pivot;
  Int k;
  Int pos;
  Int num_updates;
  int in_stack_00000084;
  char *in_stack_00000088;
  char in_stack_00000097;
  Vector *in_stack_00000098;
  SparseMatrix *in_stack_000000a0;
  double *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar4;
  int iVar5;
  undefined4 local_18;
  undefined4 local_14;
  
  sVar1 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x220));
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x70),(long)in_ESI);
  local_14 = *pvVar2;
  for (local_18 = 0; local_18 < (int)sVar1; local_18 = local_18 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x220),(long)local_18);
    if (*pvVar2 == local_14) {
      local_14 = *(int *)(in_RDI + 0x18) + local_18;
    }
  }
  std::valarray<double>::operator=
            ((valarray<double> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8);
  pdVar3 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0x250),(long)local_14);
  *pdVar3 = 1.0;
  TriangularSolve(in_stack_000000a0,in_stack_00000098,in_stack_00000097,in_stack_00000088,
                  in_stack_00000084);
  SparseMatrix::clear_queue
            ((SparseMatrix *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0x250),(long)local_14);
  iVar4 = local_14;
  while (iVar4 = iVar4 + 1, iVar4 < *(int *)(in_RDI + 0x18) + (int)sVar1) {
    pdVar3 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0x250),(long)iVar4);
    if ((*pdVar3 != 0.0) || (NAN(*pdVar3))) {
      iVar5 = iVar4;
      std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0x250),(long)iVar4);
      SparseMatrix::push_back
                ((SparseMatrix *)CONCAT44(iVar5,in_stack_ffffffffffffffd0),
                 (Int)((ulong)in_RDI >> 0x20),(double)CONCAT44(iVar4,in_stack_ffffffffffffffc0));
      iVar4 = iVar5;
    }
  }
  *(undefined1 *)(in_RDI + 0x23c) = 1;
  *(value_type *)(in_RDI + 0x238) = local_14;
  return;
}

Assistant:

void ForrestTomlin::ComputeEta(Int j) {
    Int num_updates = replaced_.size();
    assert(U_.cols() == dim_+num_updates);

    // Find permuted position of j.
    Int pos = colperm_inv_[j];
    for (Int k = 0; k < num_updates; k++)
        if (replaced_[k] == pos)
            pos = dim_+k;

    // Solve lhs'U=e_pos'. Replaced position must remain zero (by the fact that
    // the corresponding columns of U are unit), so replaced indices cannot
    // occur in the new eta matrix.
    work_ = 0.0;
    work_[pos] = 1.0;
    TriangularSolve(U_, work_, 't', "upper", 0);
    #ifndef NDEBUG
    for (Int k = 0; k < num_updates; k++)
        assert(work_[replaced_[k]] == 0.0);
    #endif

    // Queue eta at end of R. Indices are sorted, which is required for the
    // sparse dot product in Update().
    R_.clear_queue();
    double pivot = work_[pos];
    for (Int i = pos+1; i < dim_+num_updates; i++) {
        if (work_[i] != 0.0)
            R_.push_back(i, -work_[i]/pivot);
    }
    have_btran_ = true;
    replace_next_ = pos;
}